

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O2

uint megumax::select_best_child_index(UCTNode *node)

{
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *pvVar1;
  ulong idx;
  size_t idx_00;
  double dVar2;
  double dVar3;
  
  idx = 1;
  idx_00 = 0;
  while( true ) {
    pvVar1 = UCTNode::children(node);
    if ((ulong)(((long)(pvVar1->
                       super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar1->
                      super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x58) <= idx) break;
    dVar2 = UCTNode::child_score(node,idx);
    dVar3 = UCTNode::child_score(node,idx_00);
    if (dVar3 < dVar2) {
      idx_00 = idx;
    }
    idx = (ulong)((int)idx + 1);
  }
  return (uint)idx_00;
}

Assistant:

unsigned select_best_child_index(const UCTNode* node) {
    unsigned best_node_index = 0;
    for (unsigned i = 1; i < node->children().size(); ++i) {
        if (node->child_score(i) > node->child_score(best_node_index)) {
            best_node_index = i;
        }
    }
    return best_node_index;
}